

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::FoundationPileWithAceTest::FoundationPileWithAceTest
          (FoundationPileWithAceTest *this)

{
  allocator<solitaire::cards::Card> *this_00;
  initializer_list<solitaire::cards::Card> __l;
  reference __t;
  element_type *peVar1;
  undefined1 local_44 [8];
  optional<solitaire::cards::Card> cardToAdd;
  Card local_28;
  iterator local_20;
  size_type local_18;
  FoundationPileWithAceTest *local_10;
  FoundationPileWithAceTest *this_local;
  
  local_10 = this;
  EmptyFoundationPileTest::EmptyFoundationPileTest(&this->super_EmptyFoundationPileTest);
  (this->super_EmptyFoundationPileTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileWithAceTest_00509e58;
  solitaire::cards::Card::Card(&local_28,Ace,Heart);
  local_20 = &local_28;
  local_18 = 1;
  this_00 = (allocator<solitaire::cards::Card> *)
            ((long)&cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
                    super__Optional_payload_base<solitaire::cards::Card>._M_payload + 7);
  std::allocator<solitaire::cards::Card>::allocator(this_00);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->pileCards,__l,this_00);
  std::allocator<solitaire::cards::Card>::~allocator
            ((allocator<solitaire::cards::Card> *)
             ((long)&cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
                     super__Optional_payload_base<solitaire::cards::Card>._M_payload + 7));
  __t = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::front
                  (&this->pileCards);
  std::optional<solitaire::cards::Card>::optional<solitaire::cards::Card_&,_true>
            ((optional<solitaire::cards::Card> *)local_44,__t);
  peVar1 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_EmptyFoundationPileTest).pile);
  (*(peVar1->super_FoundationPile).super_Archiver._vptr_Archiver[4])
            (peVar1,(optional<solitaire::cards::Card> *)local_44);
  return;
}

Assistant:

FoundationPileWithAceTest() {
        std::optional<Card> cardToAdd = pileCards.front();
        pile->tryAddCard(cardToAdd);
    }